

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> * __thiscall
spirv_cross::CompilerGLSL::get_composite_constant_ids
          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *__return_storage_ptr__,
          CompilerGLSL *this,ConstantID const_id)

{
  bool bVar1;
  uint32_t uVar2;
  CompilerError *pCVar3;
  size_type sVar4;
  mapped_type *other;
  uint32_t local_98;
  undefined1 local_92;
  allocator local_91;
  string local_90 [36];
  uint32_t local_6c;
  undefined1 local_65;
  allocator local_51;
  string local_50 [32];
  SPIRType *local_30;
  SPIRType *type;
  SPIRConstant *constant;
  CompilerGLSL *this_local;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *pSStack_10;
  ConstantID const_id_local;
  
  constant = (SPIRConstant *)this;
  this_local._4_4_ = const_id.id;
  pSStack_10 = __return_storage_ptr__;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  type = (SPIRType *)Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar2);
  if ((SPIRConstant *)type == (SPIRConstant *)0x0) {
    local_6c = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    sVar4 = ::std::
            unordered_map<unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>_>
            ::count(&this->const_composite_insert_ids,&local_6c);
    if (sVar4 == 0) {
      local_92 = 1;
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_90,"Unimplemented for this OpSpecConstantOp!",&local_91);
      CompilerError::CompilerError(pCVar3,(string *)local_90);
      local_92 = 0;
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_98 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    other = ::std::
            unordered_map<unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>_>
            ::operator[](&this->const_composite_insert_ids,&local_98);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::SmallVector
              (__return_storage_ptr__,other);
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(((SPIRConstant *)type)->super_IVariant).field_0xc);
    local_30 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
    bVar1 = Compiler::is_array(&this->super_Compiler,local_30);
    if ((bVar1) || (*(int *)&(local_30->super_IVariant).field_0xc == 0xf)) {
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::SmallVector
                (__return_storage_ptr__,
                 (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&type->type_alias)
      ;
    }
    else {
      bVar1 = Compiler::is_matrix(&this->super_Compiler,local_30);
      if (bVar1) {
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul>::
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,4ul>
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul> *)
                   __return_storage_ptr__,
                   (TypedID<(spirv_cross::Types)0> (*) [4])
                   ((type->member_type_index_redirection).stack_storage.aligned_char + 0x18));
      }
      else {
        bVar1 = Compiler::is_vector(&this->super_Compiler,local_30);
        if (!bVar1) {
          local_65 = 1;
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_50,"Unexpected scalar constant!",&local_51);
          CompilerError::CompilerError(pCVar3,(string *)local_50);
          local_65 = 0;
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul>::
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,4ul>
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul> *)
                   __return_storage_ptr__,
                   (TypedID<(spirv_cross::Types)0> (*) [4])&(type->array).buffer_capacity);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SmallVector<ConstantID> CompilerGLSL::get_composite_constant_ids(ConstantID const_id)
{
	if (auto *constant = maybe_get<SPIRConstant>(const_id))
	{
		const auto &type = get<SPIRType>(constant->constant_type);
		if (is_array(type) || type.basetype == SPIRType::Struct)
			return constant->subconstants;
		if (is_matrix(type))
			return SmallVector<ConstantID>(constant->m.id);
		if (is_vector(type))
			return SmallVector<ConstantID>(constant->m.c[0].id);
		SPIRV_CROSS_THROW("Unexpected scalar constant!");
	}
	if (!const_composite_insert_ids.count(const_id))
		SPIRV_CROSS_THROW("Unimplemented for this OpSpecConstantOp!");
	return const_composite_insert_ids[const_id];
}